

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_json_psbt.cpp
# Opt level: O2

void cfd::api::json::PsbtJsonApi::DecodePsbt
               (DecodePsbtRequest *request,DecodePsbtResponse *response)

{
  string *psVar1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  JsonObjectVector<cfd::api::json::PsbtMapData,_PsbtMapDataStruct> *pJVar2;
  JsonObjectVector<cfd::api::json::DecodePsbtInput,_DecodePsbtInputStruct> *pJVar3;
  JsonObjectVector<cfd::api::json::DecodePsbtOutput,_DecodePsbtOutputStruct> *pJVar4;
  DecodePsbtResponse *pDVar5;
  pointer pBVar6;
  pointer pPVar7;
  pointer pKVar8;
  uint8_t uVar9;
  bool bVar10;
  byte bVar11;
  bool bVar12;
  NetType type;
  uint32_t uVar13;
  uint32_t uVar14;
  uint32_t index;
  undefined8 uVar15;
  int64_t iVar16;
  CfdException *pCVar17;
  pointer pKVar18;
  pointer pBVar19;
  KeyData *pKVar20;
  iterator __begin4;
  pointer __x;
  KeyData *pKVar21;
  Amount AVar22;
  uint local_bc0;
  bool is_witness;
  DecodePsbtResponse *local_bb0;
  DecodePsbtRequest *local_ba8;
  ulong local_ba0;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> key_list;
  Amount total_output;
  Script redeem_script;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> witness_stack;
  string local_ae0 [32];
  string local_ac0 [32];
  string local_aa0 [32];
  string local_a80 [32];
  Psbt psbt;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> sig_pubkey_list;
  Amount total_input;
  ByteData data;
  string local_9b0 [32];
  string local_990 [248];
  Script witness_script;
  Transaction full_utxo;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> bip32_pubkey_list;
  TxOut utxo;
  ByteData data_1;
  string tx_hex;
  AddressFactory addr_factory;
  Transaction tx;
  string local_710;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> xpub_list;
  Script local_6d8 [2];
  PsbtGlobalXpub xpub_obj;
  string local_538 [72];
  vector<cfd::api::json::PsbtBip32Data,std::allocator<cfd::api::json::PsbtBip32Data>> local_4f0 [32]
  ;
  pointer local_4d0;
  pointer local_4c8;
  string local_4c0 [32];
  string local_4a0 [32];
  string local_480 [32];
  string local_460 [40];
  vector<cfd::api::json::PsbtSignatureData,std::allocator<cfd::api::json::PsbtSignatureData>>
  local_438 [24];
  string local_420 [88];
  string local_3c8 [32];
  string local_3a8 [32];
  string local_388 [88];
  string local_330 [32];
  string local_310 [32];
  string local_2f0 [40];
  vector<cfd::api::json::PsbtBip32Data,std::allocator<cfd::api::json::PsbtBip32Data>> local_2c8 [80]
  ;
  string local_278 [32];
  string local_258 [40];
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> local_230 [32];
  pointer local_210;
  pointer local_208;
  PsbtMapData item;
  DecodeRawTransactionRequest tx_req;
  DecodeRawTransactionResponse tx_res;
  
  local_ba8 = request;
  if (request == (DecodePsbtRequest *)0x0) {
    pCVar17 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&xpub_obj,"request is null.",(allocator *)&data);
    core::CfdException::CfdException(pCVar17,kCfdIllegalArgumentError,(string *)&xpub_obj);
    __cxa_throw(pCVar17,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  local_bb0 = response;
  if (response == (DecodePsbtResponse *)0x0) {
    pCVar17 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&xpub_obj,"response is null.",(allocator *)&data);
    core::CfdException::CfdException(pCVar17,kCfdIllegalArgumentError,(string *)&xpub_obj);
    __cxa_throw(pCVar17,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  std::__cxx11::string::string((string *)&local_710,(string *)&request->psbt_);
  if (local_710._M_string_length == 0) {
    xpub_obj.super_JsonClassBase<cfd::api::json::PsbtGlobalXpub>._vptr_JsonClassBase =
         (_func_int **)0x50159e;
    xpub_obj.ignore_items._M_t._M_impl._0_4_ = 0x44;
    xpub_obj.ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = anon_var_dwarf_1f86b7
    ;
    core::logger::warn<>((CfdSourceLocation *)&xpub_obj,"Failed to DecodePsbt. empty psbt.");
    pCVar17 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&xpub_obj,"Invalid hex string. empty data.",(allocator *)&data);
    core::CfdException::CfdException(pCVar17,kCfdIllegalArgumentError,(string *)&xpub_obj);
    __cxa_throw(pCVar17,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  psVar1 = &request->network_;
  std::__cxx11::string::string((string *)&xpub_obj,(string *)psVar1);
  type = TransactionJsonApi::ConvertNetType((string *)&xpub_obj);
  std::__cxx11::string::~string((string *)&xpub_obj);
  AddressFactory::AddressFactory(&addr_factory,type);
  core::Psbt::Psbt(&psbt,&local_710);
  core::Psbt::GetTransaction(&tx,&psbt);
  DecodeRawTransactionRequest::DecodeRawTransactionRequest(&tx_req);
  DecodeRawTransactionResponse::DecodeRawTransactionResponse(&tx_res);
  PsbtMapData::PsbtMapData(&item);
  core::AbstractTransaction::GetHex_abi_cxx11_(&tx_hex,&tx.super_AbstractTransaction);
  std::__cxx11::string::_M_assign((string *)&tx_req.hex_);
  std::__cxx11::string::string((string *)&xpub_obj,(string *)psVar1);
  std::__cxx11::string::_M_assign((string *)&tx_req.network_);
  std::__cxx11::string::~string((string *)&xpub_obj);
  TransactionJsonApi::DecodeRawTransaction(&tx_req,&tx_res);
  DecodeRawTransactionResponse::operator=(&local_bb0->tx_,&tx_res);
  if (local_ba8->has_detail_ == true) {
    std::__cxx11::string::_M_assign((string *)&local_bb0->tx_hex_);
    if (local_ba8->has_simple_ == true) {
      std::__cxx11::string::string((string *)&xpub_obj,"tx",(allocator *)&data);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&local_bb0->ignore_items,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&xpub_obj);
      goto LAB_003c866f;
    }
  }
  else {
    std::__cxx11::string::string((string *)&xpub_obj,"tx_hex",(allocator *)&data);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&local_bb0->ignore_items,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&xpub_obj);
LAB_003c866f:
    std::__cxx11::string::~string((string *)&xpub_obj);
  }
  core::Psbt::GetGlobalRecordKeyList(&key_list,&psbt);
  if (local_ba8->has_detail_ == true) {
    uVar13 = core::Psbt::GetPsbtVersion(&psbt);
    pDVar5 = local_bb0;
    local_bb0->version_ = uVar13;
    core::Psbt::GetGlobalXpubkeyDataList(&xpub_list,&psbt);
    pKVar8 = xpub_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pKVar18 = xpub_list.
                   super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
                   _M_impl.super__Vector_impl_data._M_start; pKVar18 != pKVar8;
        pKVar18 = pKVar18 + 1) {
      core::KeyData::GetExtPubkey((ExtPubkey *)&data,pKVar18);
      PsbtGlobalXpub::PsbtGlobalXpub(&xpub_obj);
      core::ExtPubkey::ToString_abi_cxx11_((string *)&witness_stack,(ExtPubkey *)&data);
      std::__cxx11::string::_M_assign((string *)&xpub_obj.xpub_.base58_);
      std::__cxx11::string::~string((string *)&witness_stack);
      core::ExtPubkey::GetData((ByteData *)&utxo,(ExtPubkey *)&data);
      core::ByteData::GetHex_abi_cxx11_((string *)&witness_stack,(ByteData *)&utxo);
      std::__cxx11::string::_M_assign((string *)&xpub_obj.xpub_.hex_);
      std::__cxx11::string::~string((string *)&witness_stack);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&utxo);
      core::KeyData::GetBip32Path_abi_cxx11_((string *)&witness_stack,pKVar18,kApostrophe,false);
      std::__cxx11::string::_M_assign((string *)&xpub_obj.path_);
      std::__cxx11::string::~string((string *)&witness_stack);
      core::KeyData::GetFingerprint((ByteData *)&utxo,pKVar18);
      core::ByteData::GetHex_abi_cxx11_((string *)&witness_stack,(ByteData *)&utxo);
      std::__cxx11::string::_M_assign((string *)&xpub_obj.master_fingerprint_);
      std::__cxx11::string::~string((string *)&witness_stack);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&utxo);
      core::KeyData::ToString_abi_cxx11_((string *)&witness_stack,pKVar18,true,kApostrophe,false);
      std::__cxx11::string::_M_assign((string *)&xpub_obj.descriptor_xpub_);
      std::__cxx11::string::~string((string *)&witness_stack);
      std::vector<cfd::api::json::PsbtGlobalXpub,std::allocator<cfd::api::json::PsbtGlobalXpub>>::
      emplace_back<cfd::api::json::PsbtGlobalXpub&>
                ((vector<cfd::api::json::PsbtGlobalXpub,std::allocator<cfd::api::json::PsbtGlobalXpub>>
                  *)&(pDVar5->xpubs_).super_JsonVector<cfd::api::json::PsbtGlobalXpub>.
                     super_vector<cfd::api::json::PsbtGlobalXpub,_std::allocator<cfd::api::json::PsbtGlobalXpub>_>
                 ,&xpub_obj);
      PsbtGlobalXpub::~PsbtGlobalXpub(&xpub_obj);
      core::ExtPubkey::~ExtPubkey((ExtPubkey *)&data);
    }
    if ((local_bb0->xpubs_).super_JsonVector<cfd::api::json::PsbtGlobalXpub>.
        super_vector<cfd::api::json::PsbtGlobalXpub,_std::allocator<cfd::api::json::PsbtGlobalXpub>_>
        .
        super__Vector_base<cfd::api::json::PsbtGlobalXpub,_std::allocator<cfd::api::json::PsbtGlobalXpub>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (local_bb0->xpubs_).super_JsonVector<cfd::api::json::PsbtGlobalXpub>.
        super_vector<cfd::api::json::PsbtGlobalXpub,_std::allocator<cfd::api::json::PsbtGlobalXpub>_>
        .
        super__Vector_base<cfd::api::json::PsbtGlobalXpub,_std::allocator<cfd::api::json::PsbtGlobalXpub>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::string((string *)&xpub_obj,"xpubs",(allocator *)&data);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&local_bb0->ignore_items,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&xpub_obj);
      std::__cxx11::string::~string((string *)&xpub_obj);
    }
    std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector(&xpub_list);
  }
  else {
    std::__cxx11::string::string((string *)&xpub_obj,"version",(allocator *)&data);
    this = &local_bb0->ignore_items;
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &xpub_obj);
    std::__cxx11::string::~string((string *)&xpub_obj);
    std::__cxx11::string::string((string *)&xpub_obj,"xpubs",(allocator *)&data);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &xpub_obj);
    std::__cxx11::string::~string((string *)&xpub_obj);
    uVar13 = core::Psbt::GetPsbtVersion(&psbt);
    if (uVar13 != 0) {
      std::__cxx11::string::string((string *)&xpub_obj,"fb",(allocator *)&witness_stack);
      core::ByteData::ByteData(&data,(string *)&xpub_obj);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::
      emplace_back<cfd::core::ByteData>(&key_list,&data);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
      std::__cxx11::string::~string((string *)&xpub_obj);
    }
  }
  uVar13 = core::Psbt::GetPsbtVersion(&psbt);
  if (uVar13 != 0) {
    std::__cxx11::string::string((string *)&xpub_obj,"fb",(allocator *)&witness_stack);
    core::ByteData::ByteData(&data,(string *)&xpub_obj);
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::
    emplace_back<cfd::core::ByteData>(&key_list,&data);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
    std::__cxx11::string::~string((string *)&xpub_obj);
  }
  pBVar6 = key_list.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pJVar2 = &local_bb0->unknown_;
  for (pBVar19 = key_list.
                 super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                 _M_impl.super__Vector_impl_data._M_start; pBVar19 != pBVar6; pBVar19 = pBVar19 + 1)
  {
    if (local_ba8->has_detail_ == true) {
      uVar9 = core::ByteData::GetHeadData(pBVar19);
      if (uVar9 != '\x01') goto LAB_003c8a39;
    }
    else {
LAB_003c8a39:
      core::Psbt::GetGlobalRecord(&data,&psbt,pBVar19);
      core::ByteData::GetHex_abi_cxx11_((string *)&xpub_obj,pBVar19);
      std::__cxx11::string::_M_assign((string *)&item.key_);
      std::__cxx11::string::~string((string *)&xpub_obj);
      core::ByteData::GetHex_abi_cxx11_((string *)&xpub_obj,&data);
      std::__cxx11::string::_M_assign((string *)&item.value_);
      std::__cxx11::string::~string((string *)&xpub_obj);
      std::vector<cfd::api::json::PsbtMapData,std::allocator<cfd::api::json::PsbtMapData>>::
      emplace_back<cfd::api::json::PsbtMapData&>
                ((vector<cfd::api::json::PsbtMapData,std::allocator<cfd::api::json::PsbtMapData>> *)
                 &(pJVar2->super_JsonVector<cfd::api::json::PsbtMapData>).
                  super_vector<cfd::api::json::PsbtMapData,_std::allocator<cfd::api::json::PsbtMapData>_>
                 ,&item);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
    }
  }
  if ((local_ba8->has_simple_ != false) &&
     ((local_bb0->unknown_).super_JsonVector<cfd::api::json::PsbtMapData>.
      super_vector<cfd::api::json::PsbtMapData,_std::allocator<cfd::api::json::PsbtMapData>_>.
      super__Vector_base<cfd::api::json::PsbtMapData,_std::allocator<cfd::api::json::PsbtMapData>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (local_bb0->unknown_).super_JsonVector<cfd::api::json::PsbtMapData>.
      super_vector<cfd::api::json::PsbtMapData,_std::allocator<cfd::api::json::PsbtMapData>_>.
      super__Vector_base<cfd::api::json::PsbtMapData,_std::allocator<cfd::api::json::PsbtMapData>_>.
      _M_impl.super__Vector_impl_data._M_finish)) {
    std::__cxx11::string::string((string *)&xpub_obj,"unknown",(allocator *)&data);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&local_bb0->ignore_items,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&xpub_obj);
    std::__cxx11::string::~string((string *)&xpub_obj);
  }
  core::Amount::Amount(&total_input);
  uVar13 = core::Transaction::GetTxInCount(&tx);
  pJVar3 = &local_bb0->inputs_;
  local_ba0 = 0;
  for (index = 0; index != uVar13; index = index + 1) {
    DecodePsbtInput::DecodePsbtInput((DecodePsbtInput *)&xpub_obj);
    core::Transaction::GetTxIn((TxInReference *)&xpub_list,&tx,index);
    is_witness = false;
    core::Psbt::GetTxInUtxo((TxOut *)&utxo.super_AbstractTxOut,&psbt,index,true,&is_witness);
    core::AbstractTxOut::GetLockingScript((Script *)&data,&utxo.super_AbstractTxOut);
    bVar10 = core::Script::IsEmpty((Script *)&data);
    bVar11 = is_witness ^ 1;
    core::Script::~Script((Script *)&data);
    if (bVar10 || (bVar11 & 1) != 0) {
      std::__cxx11::string::string((string *)&data,"witness_utxo",(allocator *)&witness_stack);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&xpub_obj.ignore_items,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&data);
      pKVar20 = (KeyData *)&data;
    }
    else {
      AVar22 = core::AbstractTxOut::GetValue(&utxo.super_AbstractTxOut);
      data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)AVar22.amount_;
      data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)CONCAT71(data.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish._1_7_,AVar22.ignore_check_);
      core::Amount::operator+=(&total_input,(Amount *)&data);
      AVar22 = core::AbstractTxOut::GetValue(&utxo.super_AbstractTxOut);
      data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)AVar22.amount_;
      data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)CONCAT71(data.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish._1_7_,AVar22.ignore_check_);
      local_538._56_8_ = core::Amount::GetSatoshiValue((Amount *)&data);
      witness_stack.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)&witness_stack.
                     super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
      witness_stack.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      witness_stack.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      core::AbstractTxOut::GetLockingScript((Script *)&data,&utxo.super_AbstractTxOut);
      TransactionJsonApi::ConvertFromLockingScript
                ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)&redeem_script,
                 &addr_factory,(Script *)&data,(string *)&witness_stack,(int64_t *)0x0);
      core::Script::~Script((Script *)&data);
      if (redeem_script._vptr_Script !=
          (_func_int **)
          CONCAT71(redeem_script.script_data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start._1_7_,
                   redeem_script.script_data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start._0_1_)) {
        core::Address::GetAddress_abi_cxx11_((string *)&data,(Address *)redeem_script._vptr_Script);
        std::__cxx11::string::_M_assign(local_460);
        std::__cxx11::string::~string((string *)&data);
      }
      core::AbstractTxOut::GetLockingScript((Script *)&data,&utxo.super_AbstractTxOut);
      core::Script::GetHex_abi_cxx11_((string *)&full_utxo,(Script *)&data);
      std::__cxx11::string::_M_assign(local_4a0);
      std::__cxx11::string::~string((string *)&full_utxo);
      core::Script::~Script((Script *)&data);
      core::AbstractTxOut::GetLockingScript((Script *)&data,&utxo.super_AbstractTxOut);
      core::Script::ToString_abi_cxx11_((string *)&full_utxo,(Script *)&data);
      std::__cxx11::string::_M_assign(local_4c0);
      std::__cxx11::string::~string((string *)&full_utxo);
      core::Script::~Script((Script *)&data);
      pKVar20 = (KeyData *)&witness_stack;
      std::__cxx11::string::_M_assign(local_480);
      std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::~vector
                ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)&redeem_script);
    }
    std::__cxx11::string::~string((string *)pKVar20);
    core::Psbt::GetTxInUtxoFull(&full_utxo,&psbt,index,true,(bool *)0x0);
    core::AbstractTransaction::GetTxid((Txid *)&data,&full_utxo.super_AbstractTransaction);
    core::Txid::Txid((Txid *)&witness_stack,
                     (Txid *)&xpub_list.
                              super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>
                              ._M_impl.super__Vector_impl_data._M_finish);
    bVar12 = core::Txid::Equals((Txid *)&data,(Txid *)&witness_stack);
    core::Txid::~Txid((Txid *)&witness_stack);
    core::Txid::~Txid((Txid *)&data);
    if (bVar12) {
      core::AbstractTransaction::GetHex_abi_cxx11_
                ((string *)&witness_stack,&full_utxo.super_AbstractTransaction);
      std::__cxx11::string::_M_assign((string *)&tx_req.hex_);
      std::__cxx11::string::string((string *)&data,(string *)psVar1);
      std::__cxx11::string::_M_assign((string *)&tx_req.network_);
      std::__cxx11::string::~string((string *)&data);
      TransactionJsonApi::DecodeRawTransaction(&tx_req,&tx_res);
      DecodeRawTransactionResponse::operator=
                ((DecodeRawTransactionResponse *)
                 ((long)&xpub_obj.xpub_.ignore_items._M_t._M_impl.super__Rb_tree_header._M_header +
                 0x10),&tx_res);
      if (local_ba8->has_detail_ == true) {
        std::__cxx11::string::_M_assign((string *)&xpub_obj.xpub_);
        if (witness_stack.
            super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
            super__Vector_impl_data._M_finish == (pointer)0x0) {
          std::__cxx11::string::string
                    ((string *)&data,"non_witness_utxo_hex",(allocator *)&redeem_script);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&xpub_obj.ignore_items,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&data);
          std::__cxx11::string::~string((string *)&data);
        }
        if (local_ba8->has_simple_ == true) {
          std::__cxx11::string::string
                    ((string *)&data,"non_witness_utxo",(allocator *)&redeem_script);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&xpub_obj.ignore_items,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&data);
          goto LAB_003c8fa1;
        }
      }
      else {
        std::__cxx11::string::string
                  ((string *)&data,"non_witness_utxo_hex",(allocator *)&redeem_script);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&xpub_obj.ignore_items,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&data);
LAB_003c8fa1:
        std::__cxx11::string::~string((string *)&data);
      }
      if (bVar10 || (bVar11 & 1) != 0) {
        uVar14 = core::Transaction::GetTxOutCount(&full_utxo);
        if ((uint)local_6d8[0].script_data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish < uVar14) {
          core::Transaction::GetTxOut
                    ((TxOutReference *)&data,&full_utxo,
                     (uint)local_6d8[0].script_data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish);
          redeem_script._vptr_Script =
               (_func_int **)
               data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
          redeem_script.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start._0_1_ =
               data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._0_1_;
          core::Amount::operator+=(&total_input,(Amount *)&redeem_script);
          core::AbstractTxOutReference::~AbstractTxOutReference((AbstractTxOutReference *)&data);
        }
        else {
          std::__cxx11::string::string
                    ((string *)&data,"non_witness_utxo",(allocator *)&redeem_script);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&xpub_obj.ignore_items,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&data);
          uVar15 = std::__cxx11::string::~string((string *)&data);
          local_ba0 = CONCAT71((int7)((ulong)uVar15 >> 8),1);
        }
      }
      std::__cxx11::string::~string((string *)&witness_stack);
    }
    else {
      std::__cxx11::string::string((string *)&data,"non_witness_utxo",(allocator *)&witness_stack);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&xpub_obj.ignore_items,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&data);
      std::__cxx11::string::~string((string *)&data);
      std::__cxx11::string::string
                ((string *)&data,"non_witness_utxo_hex",(allocator *)&witness_stack);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&xpub_obj.ignore_items,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&data);
      std::__cxx11::string::~string((string *)&data);
      local_ba0 = CONCAT71((int7)(local_ba0 >> 8),(byte)local_ba0 | bVar10 | bVar11);
    }
    core::Psbt::GetTxInSignaturePubkeyList(&sig_pubkey_list,&psbt,index);
    pPVar7 = sig_pubkey_list.
             super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
             super__Vector_impl_data._M_finish;
    __x = (pointer)CONCAT71(sig_pubkey_list.
                            super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>
                            ._M_impl.super__Vector_impl_data._M_start._1_7_,
                            (char)sig_pubkey_list.
                                  super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
    if (__x == sig_pubkey_list.
               super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
               super__Vector_impl_data._M_finish) {
      std::__cxx11::string::string((string *)&data,"partial_signatures",(allocator *)&witness_stack)
      ;
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&xpub_obj.ignore_items,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&data);
      std::__cxx11::string::~string((string *)&data);
    }
    else {
      for (; __x != pPVar7; __x = __x + 1) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&redeem_script,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)__x);
        core::Psbt::GetTxInSignature
                  ((ByteData *)&witness_script,&psbt,index,(Pubkey *)&redeem_script);
        PsbtSignatureData::PsbtSignatureData((PsbtSignatureData *)&data);
        core::Pubkey::GetHex_abi_cxx11_((string *)&witness_stack,(Pubkey *)&redeem_script);
        std::__cxx11::string::_M_assign(local_9b0);
        std::__cxx11::string::~string((string *)&witness_stack);
        core::ByteData::GetHex_abi_cxx11_((string *)&witness_stack,(ByteData *)&witness_script);
        std::__cxx11::string::_M_assign(local_990);
        std::__cxx11::string::~string((string *)&witness_stack);
        std::
        vector<cfd::api::json::PsbtSignatureData,std::allocator<cfd::api::json::PsbtSignatureData>>
        ::emplace_back<cfd::api::json::PsbtSignatureData&>(local_438,(PsbtSignatureData *)&data);
        PsbtSignatureData::~PsbtSignatureData((PsbtSignatureData *)&data);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&witness_script);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&redeem_script);
      }
    }
    bVar10 = core::Psbt::IsFindTxInSighashType(&psbt,index);
    if (bVar10) {
      core::Psbt::GetTxInSighashType((Psbt *)&witness_stack,(uint32_t)&psbt);
      core::SigHashType::ToString_abi_cxx11_((string *)&data,(SigHashType *)&witness_stack);
      std::__cxx11::string::_M_assign(local_420);
    }
    else {
      std::__cxx11::string::string((string *)&data,"sighash",(allocator *)&witness_stack);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&xpub_obj.ignore_items,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&data);
    }
    std::__cxx11::string::~string((string *)&data);
    core::Psbt::GetTxInRedeemScriptDirect(&redeem_script,&psbt,index,true,false);
    bVar10 = core::Script::IsEmpty(&redeem_script);
    if (bVar10) {
      std::__cxx11::string::string((string *)&data,"redeem_script",(allocator *)&witness_stack);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&xpub_obj.ignore_items,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&data);
      std::__cxx11::string::~string((string *)&data);
    }
    else {
      data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)&data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
      data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      TransactionJsonApi::ConvertFromLockingScript
                ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)&witness_script,
                 &addr_factory,&redeem_script,(string *)&data,(int64_t *)0x0);
      core::Script::GetHex_abi_cxx11_((string *)&witness_stack,&redeem_script);
      std::__cxx11::string::_M_assign(local_3a8);
      std::__cxx11::string::~string((string *)&witness_stack);
      core::Script::ToString_abi_cxx11_((string *)&witness_stack,&redeem_script);
      std::__cxx11::string::_M_assign(local_3c8);
      std::__cxx11::string::~string((string *)&witness_stack);
      std::__cxx11::string::_M_assign(local_388);
      std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::~vector
                ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)&witness_script)
      ;
      std::__cxx11::string::~string((string *)&data);
    }
    core::Psbt::GetTxInRedeemScriptDirect(&witness_script,&psbt,index,true,true);
    bVar10 = core::Script::IsEmpty(&witness_script);
    if (bVar10) {
      std::__cxx11::string::string((string *)&data,"witness_script",(allocator *)&witness_stack);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&xpub_obj.ignore_items,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&data);
    }
    else {
      data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)&data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
      data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      TransactionJsonApi::ConvertFromLockingScript
                ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)&total_output,
                 &addr_factory,&witness_script,(string *)&data,(int64_t *)0x0);
      core::Script::GetHex_abi_cxx11_((string *)&witness_stack,&witness_script);
      std::__cxx11::string::_M_assign(local_310);
      std::__cxx11::string::~string((string *)&witness_stack);
      core::Script::ToString_abi_cxx11_((string *)&witness_stack,&witness_script);
      std::__cxx11::string::_M_assign(local_330);
      std::__cxx11::string::~string((string *)&witness_stack);
      std::__cxx11::string::_M_assign(local_2f0);
      std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::~vector
                ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)&total_output);
    }
    std::__cxx11::string::~string((string *)&data);
    core::Psbt::GetTxInKeyDataList(&bip32_pubkey_list,&psbt,index);
    pKVar8 = bip32_pubkey_list.
             super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pKVar18 = bip32_pubkey_list.
              super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (bip32_pubkey_list.
        super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
        super__Vector_impl_data._M_start ==
        bip32_pubkey_list.
        super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::__cxx11::string::string((string *)&data,"bip32_derivs",(allocator *)&witness_stack);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&xpub_obj.ignore_items,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&data);
      std::__cxx11::string::~string((string *)&data);
    }
    else {
      for (; pKVar18 != pKVar8; pKVar18 = pKVar18 + 1) {
        core::KeyData::KeyData((KeyData *)&data,pKVar18);
        PsbtBip32Data::PsbtBip32Data((PsbtBip32Data *)&witness_stack);
        core::KeyData::GetPubkey((Pubkey *)&data_1,(KeyData *)&data);
        core::Pubkey::GetHex_abi_cxx11_((string *)&total_output,(Pubkey *)&data_1);
        std::__cxx11::string::_M_assign(local_ae0);
        std::__cxx11::string::~string((string *)&total_output);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data_1);
        core::KeyData::GetFingerprint(&data_1,(KeyData *)&data);
        core::ByteData::GetHex_abi_cxx11_((string *)&total_output,&data_1);
        std::__cxx11::string::_M_assign(local_ac0);
        std::__cxx11::string::~string((string *)&total_output);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data_1);
        core::KeyData::GetBip32Path_abi_cxx11_
                  ((string *)&total_output,(KeyData *)&data,kApostrophe,false);
        std::__cxx11::string::_M_assign(local_aa0);
        std::__cxx11::string::~string((string *)&total_output);
        if (local_ba8->has_detail_ == true) {
          core::KeyData::ToString_abi_cxx11_
                    ((string *)&total_output,(KeyData *)&data,true,kApostrophe,false);
          std::__cxx11::string::_M_assign(local_a80);
        }
        else {
          std::__cxx11::string::string((string *)&total_output,"descriptor",(allocator *)&data_1);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&witness_stack.
                         super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                         ._M_impl.super__Vector_impl_data._M_finish,(string *)&total_output);
        }
        std::__cxx11::string::~string((string *)&total_output);
        std::vector<cfd::api::json::PsbtBip32Data,std::allocator<cfd::api::json::PsbtBip32Data>>::
        emplace_back<cfd::api::json::PsbtBip32Data&>(local_2c8,(PsbtBip32Data *)&witness_stack);
        PsbtBip32Data::~PsbtBip32Data((PsbtBip32Data *)&witness_stack);
        core::KeyData::~KeyData((KeyData *)&data);
      }
    }
    core::Psbt::GetTxInFinalScript
              ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&total_output,
               &psbt,index,false);
    if (total_output.amount_ == total_output._8_8_) {
LAB_003c95f7:
      std::__cxx11::string::string((string *)&data,"final_scriptsig",(allocator *)&witness_stack);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&xpub_obj.ignore_items,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&data);
      std::__cxx11::string::~string((string *)&data);
    }
    else {
      bVar10 = core::ByteData::IsEmpty((ByteData *)total_output.amount_);
      if (bVar10) goto LAB_003c95f7;
      core::ByteData::GetHex_abi_cxx11_((string *)&data,(ByteData *)total_output.amount_);
      std::__cxx11::string::_M_assign(local_258);
      std::__cxx11::string::~string((string *)&data);
      core::Script::Script((Script *)&data,(ByteData *)total_output.amount_);
      core::Script::ToString_abi_cxx11_((string *)&witness_stack,(Script *)&data);
      std::__cxx11::string::_M_assign(local_278);
      std::__cxx11::string::~string((string *)&witness_stack);
      core::Script::~Script((Script *)&data);
    }
    core::Psbt::GetTxInFinalScript(&witness_stack,&psbt,index,true);
    pBVar6 = witness_stack.
             super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pBVar19 = witness_stack.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (witness_stack.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        witness_stack.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::string((string *)&data,"final_scriptwitness",(allocator *)&data_1);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&xpub_obj.ignore_items,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&data);
      std::__cxx11::string::~string((string *)&data);
    }
    else {
      for (; pBVar19 != pBVar6; pBVar19 = pBVar19 + 1) {
        core::ByteData::GetHex_abi_cxx11_((string *)&data,pBVar19);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  (local_230,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&data);
        std::__cxx11::string::~string((string *)&data);
      }
    }
    core::Psbt::GetTxInRecordKeyList
              ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&data,&psbt,
               index);
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::_M_move_assign
              (&key_list,(KeyData *)&data);
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
              ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&data);
    pBVar6 = key_list.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pBVar19 = key_list.
                   super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                   _M_impl.super__Vector_impl_data._M_start; pBVar19 != pBVar6;
        pBVar19 = pBVar19 + 1) {
      core::Psbt::GetTxInRecord(&data_1,&psbt,index,pBVar19);
      core::ByteData::GetHex_abi_cxx11_((string *)&data,pBVar19);
      std::__cxx11::string::_M_assign((string *)&item.key_);
      std::__cxx11::string::~string((string *)&data);
      core::ByteData::GetHex_abi_cxx11_((string *)&data,&data_1);
      std::__cxx11::string::_M_assign((string *)&item.value_);
      std::__cxx11::string::~string((string *)&data);
      std::vector<cfd::api::json::PsbtMapData,std::allocator<cfd::api::json::PsbtMapData>>::
      emplace_back<cfd::api::json::PsbtMapData&>
                ((vector<cfd::api::json::PsbtMapData,std::allocator<cfd::api::json::PsbtMapData>> *)
                 &local_210,&item);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data_1);
    }
    if (local_210 == local_208) {
      std::__cxx11::string::string((string *)&data,"unknown",(allocator *)&data_1);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&xpub_obj.ignore_items,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&data);
      std::__cxx11::string::~string((string *)&data);
    }
    std::vector<cfd::api::json::DecodePsbtInput,_std::allocator<cfd::api::json::DecodePsbtInput>_>::
    push_back(&(pJVar3->super_JsonVector<cfd::api::json::DecodePsbtInput>).
               super_vector<cfd::api::json::DecodePsbtInput,_std::allocator<cfd::api::json::DecodePsbtInput>_>
              ,(DecodePsbtInput *)&xpub_obj);
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&witness_stack);
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
              ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&total_output);
    std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
              (&bip32_pubkey_list);
    core::Script::~Script(&witness_script);
    core::Script::~Script(&redeem_script);
    std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector(&sig_pubkey_list);
    core::Transaction::~Transaction(&full_utxo);
    core::AbstractTxOut::~AbstractTxOut(&utxo.super_AbstractTxOut);
    core::AbstractTxInReference::~AbstractTxInReference((AbstractTxInReference *)&xpub_list);
    DecodePsbtInput::~DecodePsbtInput((DecodePsbtInput *)&xpub_obj);
  }
  core::Amount::Amount(&total_output);
  core::Transaction::GetTxOutCount(&tx);
  pJVar4 = &local_bb0->outputs_;
  local_bc0 = 0;
  while( true ) {
    uVar13 = core::Transaction::GetTxOutCount(&tx);
    if (uVar13 <= local_bc0) break;
    DecodePsbtOutput::DecodePsbtOutput((DecodePsbtOutput *)&xpub_obj);
    core::Transaction::GetTxOut((TxOutReference *)&xpub_list,&tx,local_bc0);
    data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)xpub_list.
                  super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
    data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)CONCAT71(data.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish._1_7_,
                           xpub_list.
                           super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_);
    core::Amount::operator+=(&total_output,(Amount *)&data);
    sig_pubkey_list.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
    _M_impl.super__Vector_impl_data._M_start._0_1_ = '\0';
    core::Psbt::GetTxOutScript((Script *)&utxo,&psbt,local_bc0,true,(bool *)&sig_pubkey_list);
    bVar10 = core::Script::IsEmpty((Script *)&utxo);
    if (bVar10) {
      std::__cxx11::string::string((string *)&data,"redeem_script",(allocator *)&witness_stack);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&xpub_obj.ignore_items,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&data);
      std::__cxx11::string::~string((string *)&data);
      std::__cxx11::string::string((string *)&data,"witness_script",(allocator *)&witness_stack);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&xpub_obj.ignore_items,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&data);
LAB_003c9b5a:
      std::__cxx11::string::~string((string *)&data);
    }
    else {
      if ((char)sig_pubkey_list.
                super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
                super__Vector_impl_data._M_start != '\x01') {
        std::__cxx11::string::string((string *)&data,"witness_script",(allocator *)&witness_stack);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&xpub_obj.ignore_items,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&data);
        std::__cxx11::string::~string((string *)&data);
        core::Script::GetHex_abi_cxx11_((string *)&data,(Script *)&utxo);
        std::__cxx11::string::_M_assign((string *)&xpub_obj.xpub_.hex_);
        std::__cxx11::string::~string((string *)&data);
        core::Script::ToString_abi_cxx11_((string *)&data,(Script *)&utxo);
        std::__cxx11::string::_M_assign((string *)&xpub_obj.xpub_.base58_);
        goto LAB_003c9b5a;
      }
      core::Script::GetHex_abi_cxx11_((string *)&data,(Script *)&utxo);
      std::__cxx11::string::_M_assign(local_538);
      std::__cxx11::string::~string((string *)&data);
      core::Script::ToString_abi_cxx11_((string *)&data,(Script *)&utxo);
      std::__cxx11::string::_M_assign
                ((string *)(xpub_obj.descriptor_xpub_.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&data);
      core::Script::Script((Script *)&data,local_6d8);
      bVar10 = core::Script::IsP2shScript((Script *)&data);
      core::Script::~Script((Script *)&data);
      if (!bVar10) {
        std::__cxx11::string::string((string *)&data,"redeem_script",(allocator *)&witness_stack);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&xpub_obj.ignore_items,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&data);
        goto LAB_003c9b5a;
      }
      core::ScriptUtil::CreateP2wshLockingScript((Script *)&data,(Script *)&utxo);
      core::Script::GetHex_abi_cxx11_((string *)&witness_stack,(Script *)&data);
      std::__cxx11::string::_M_assign((string *)&xpub_obj.xpub_.hex_);
      std::__cxx11::string::~string((string *)&witness_stack);
      core::Script::ToString_abi_cxx11_((string *)&witness_stack,(Script *)&data);
      std::__cxx11::string::_M_assign((string *)&xpub_obj.xpub_.base58_);
      std::__cxx11::string::~string((string *)&witness_stack);
      core::Script::~Script((Script *)&data);
    }
    core::Psbt::GetTxOutKeyDataList
              ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)&redeem_script,
               &psbt,local_bc0);
    pKVar20 = (KeyData *)
              CONCAT71(redeem_script.script_data_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._1_7_,
                       redeem_script.script_data_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._0_1_);
    pKVar21 = (KeyData *)redeem_script._vptr_Script;
    if ((KeyData *)redeem_script._vptr_Script == pKVar20) {
      std::__cxx11::string::string((string *)&data,"bip32_derivs",(allocator *)&witness_stack);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&xpub_obj.ignore_items,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&data);
      std::__cxx11::string::~string((string *)&data);
    }
    else {
      for (; pKVar21 != pKVar20; pKVar21 = pKVar21 + 1) {
        core::KeyData::KeyData((KeyData *)&data,pKVar21);
        PsbtBip32Data::PsbtBip32Data((PsbtBip32Data *)&witness_stack);
        core::KeyData::GetPubkey((Pubkey *)&witness_script,(KeyData *)&data);
        core::Pubkey::GetHex_abi_cxx11_((string *)&full_utxo,(Pubkey *)&witness_script);
        std::__cxx11::string::_M_assign(local_ae0);
        std::__cxx11::string::~string((string *)&full_utxo);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&witness_script);
        core::KeyData::GetFingerprint((ByteData *)&witness_script,(KeyData *)&data);
        core::ByteData::GetHex_abi_cxx11_((string *)&full_utxo,(ByteData *)&witness_script);
        std::__cxx11::string::_M_assign(local_ac0);
        std::__cxx11::string::~string((string *)&full_utxo);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&witness_script);
        core::KeyData::GetBip32Path_abi_cxx11_
                  ((string *)&full_utxo,(KeyData *)&data,kApostrophe,false);
        std::__cxx11::string::_M_assign(local_aa0);
        std::__cxx11::string::~string((string *)&full_utxo);
        if (local_ba8->has_detail_ == true) {
          core::KeyData::ToString_abi_cxx11_
                    ((string *)&full_utxo,(KeyData *)&data,true,kApostrophe,false);
          std::__cxx11::string::_M_assign(local_a80);
        }
        else {
          std::__cxx11::string::string
                    ((string *)&full_utxo,"descriptor",(allocator *)&witness_script);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&witness_stack.
                         super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&full_utxo
                    );
        }
        std::__cxx11::string::~string((string *)&full_utxo);
        std::vector<cfd::api::json::PsbtBip32Data,std::allocator<cfd::api::json::PsbtBip32Data>>::
        emplace_back<cfd::api::json::PsbtBip32Data&>(local_4f0,(PsbtBip32Data *)&witness_stack);
        PsbtBip32Data::~PsbtBip32Data((PsbtBip32Data *)&witness_stack);
        core::KeyData::~KeyData((KeyData *)&data);
      }
    }
    core::Psbt::GetTxOutRecordKeyList
              ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&data,&psbt,
               local_bc0);
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::_M_move_assign
              (&key_list,(KeyData *)&data);
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
              ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&data);
    pBVar6 = key_list.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pBVar19 = key_list.
                   super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                   _M_impl.super__Vector_impl_data._M_start; pBVar19 != pBVar6;
        pBVar19 = pBVar19 + 1) {
      core::Psbt::GetTxOutRecord((ByteData *)&witness_stack,&psbt,local_bc0,pBVar19);
      core::ByteData::GetHex_abi_cxx11_((string *)&data,pBVar19);
      std::__cxx11::string::_M_assign((string *)&item.key_);
      std::__cxx11::string::~string((string *)&data);
      core::ByteData::GetHex_abi_cxx11_((string *)&data,(ByteData *)&witness_stack);
      std::__cxx11::string::_M_assign((string *)&item.value_);
      std::__cxx11::string::~string((string *)&data);
      std::vector<cfd::api::json::PsbtMapData,std::allocator<cfd::api::json::PsbtMapData>>::
      emplace_back<cfd::api::json::PsbtMapData&>
                ((vector<cfd::api::json::PsbtMapData,std::allocator<cfd::api::json::PsbtMapData>> *)
                 &local_4d0,&item);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&witness_stack);
    }
    if (local_4d0 == local_4c8) {
      std::__cxx11::string::string((string *)&data,"unknown",(allocator *)&witness_stack);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&xpub_obj.ignore_items,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&data);
      std::__cxx11::string::~string((string *)&data);
    }
    std::vector<cfd::api::json::DecodePsbtOutput,_std::allocator<cfd::api::json::DecodePsbtOutput>_>
    ::push_back(&(pJVar4->super_JsonVector<cfd::api::json::DecodePsbtOutput>).
                 super_vector<cfd::api::json::DecodePsbtOutput,_std::allocator<cfd::api::json::DecodePsbtOutput>_>
                ,(DecodePsbtOutput *)&xpub_obj);
    std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
              ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)&redeem_script);
    core::Script::~Script((Script *)&utxo);
    core::AbstractTxOutReference::~AbstractTxOutReference((AbstractTxOutReference *)&xpub_list);
    DecodePsbtOutput::~DecodePsbtOutput((DecodePsbtOutput *)&xpub_obj);
    local_bc0 = local_bc0 + 1;
  }
  if ((local_ba0 & 1) == 0) {
    bVar10 = core::operator>(&total_output,&total_input);
    if (!bVar10) {
      AVar22 = core::operator-(&total_input,&total_output);
      xpub_obj.super_JsonClassBase<cfd::api::json::PsbtGlobalXpub>._vptr_JsonClassBase =
           (_func_int **)AVar22.amount_;
      xpub_obj.ignore_items._M_t._M_impl._0_1_ = AVar22.ignore_check_;
      iVar16 = core::Amount::GetSatoshiValue((Amount *)&xpub_obj);
      local_bb0->fee_ = iVar16;
      goto LAB_003c9ebe;
    }
  }
  std::__cxx11::string::string((string *)&xpub_obj,"fee",(allocator *)&data);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_bb0->ignore_items,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&xpub_obj);
  std::__cxx11::string::~string((string *)&xpub_obj);
LAB_003c9ebe:
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&key_list);
  std::__cxx11::string::~string((string *)&tx_hex);
  PsbtMapData::~PsbtMapData(&item);
  DecodeRawTransactionResponse::~DecodeRawTransactionResponse(&tx_res);
  DecodeRawTransactionRequest::~DecodeRawTransactionRequest(&tx_req);
  core::Transaction::~Transaction(&tx);
  core::Psbt::~Psbt(&psbt);
  AddressFactory::~AddressFactory(&addr_factory);
  std::__cxx11::string::~string((string *)&local_710);
  return;
}

Assistant:

void PsbtJsonApi::DecodePsbt(
    DecodePsbtRequest* request, DecodePsbtResponse* response) {
  if (request == nullptr) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "request is null.");
  }
  if (response == nullptr) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "response is null.");
  }
  // validate input hex
  const std::string& hex_string = request->GetPsbt();
  if (hex_string.empty()) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to DecodePsbt. empty psbt.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Invalid hex string. empty data.");
  }

  auto net_type = TransactionJsonApi::ConvertNetType(request->GetNetwork());
  AddressFactory addr_factory(net_type);

  // Decode transaction hex
  Psbt psbt(hex_string);
  Transaction tx = psbt.GetTransaction();

  DecodeRawTransactionRequest tx_req;
  DecodeRawTransactionResponse tx_res;
  PsbtMapData item;

  // global
  auto tx_hex = tx.GetHex();
  tx_req.SetHex(tx_hex);
  tx_req.SetNetwork(request->GetNetwork());
  TransactionJsonApi::DecodeRawTransaction(&tx_req, &tx_res);
  response->SetTx(tx_res);
  if (request->GetHasDetail()) {
    response->SetTx_hex(tx_hex);
    if (request->GetHasSimple()) response->SetIgnoreItem("tx");
  } else {
    response->SetIgnoreItem("tx_hex");
  }

  auto key_list = psbt.GetGlobalRecordKeyList();
    if (request->GetHasDetail()) {
      response->SetVersion(psbt.GetPsbtVersion());
      auto xpub_list = psbt.GetGlobalXpubkeyDataList();
      auto& xpubs = response->GetXpubs();
      for (const auto& xpub : xpub_list) {
        const auto& extkey = xpub.GetExtPubkey();
        PsbtGlobalXpub xpub_obj;
        auto& xpub_data = xpub_obj.GetXpub();
        xpub_data.SetBase58(extkey.ToString());
        xpub_data.SetHex(extkey.GetData().GetHex());
        xpub_obj.SetPath(xpub.GetBip32Path());
        xpub_obj.SetMaster_fingerprint(xpub.GetFingerprint().GetHex());
        xpub_obj.SetDescriptorXpub(xpub.ToString());
        xpubs.emplace_back(xpub_obj);
      }
      if (xpubs.empty()) response->SetIgnoreItem("xpubs");
    } else {
      response->SetIgnoreItem("version");
      response->SetIgnoreItem("xpubs");
      if (psbt.GetPsbtVersion() > 0) key_list.push_back(ByteData("fb"));
    }

  if (psbt.GetPsbtVersion() > 0) {
    key_list.push_back(ByteData("fb"));
  }
  auto& unknown_list = response->GetUnknown();
  for (const auto& key : key_list) {
      if (request->GetHasDetail() && (key.GetHeadData() == Psbt::kPsbtGlobalXpub)) {
        continue;
      }
    auto data = psbt.GetGlobalRecord(key);
    item.SetKey(key.GetHex());
    item.SetValue(data.GetHex());
    unknown_list.emplace_back(item);
  }
  if (request->GetHasSimple() && unknown_list.empty()) {
    response->SetIgnoreItem("unknown");
  }

  Amount total_input;
  bool is_unset_utxo = false;
  uint32_t max = static_cast<uint32_t>(tx.GetTxInCount());
  for (uint32_t index=0; index<max; ++index) {
    DecodePsbtInput input;
    auto tx_input = tx.GetTxIn(index);
    bool has_amount = false;
      bool is_witness = false;

    auto utxo = psbt.GetTxInUtxo(index, true, &is_witness);
    if (utxo.GetLockingScript().IsEmpty() || (!is_witness)) {
      input.SetIgnoreItem("witness_utxo");
    } else {
      has_amount = true;
      total_input += utxo.GetValue();
      input.GetWitness_utxo().SetAmount(utxo.GetValue().GetSatoshiValue());
      auto& script = input.GetWitness_utxo().GetScriptPubKey();

      std::string script_type;
      auto addr_list = TransactionJsonApi::ConvertFromLockingScript(
          addr_factory, utxo.GetLockingScript(), &script_type, nullptr);
      if (!addr_list.empty()) {
        script.SetAddress(addr_list[0].GetAddress());
      }
      script.SetHex(utxo.GetLockingScript().GetHex());
      script.SetAsm(utxo.GetLockingScript().ToString());
      script.SetType(script_type);
    }

    auto full_utxo = psbt.GetTxInUtxoFull(index, true);
    if (!full_utxo.GetTxid().Equals(tx_input.GetTxid())) {
      input.SetIgnoreItem("non_witness_utxo");
      input.SetIgnoreItem("non_witness_utxo_hex");
      if (!has_amount) is_unset_utxo = true;
    } else {
      auto utxo_tx_hex = full_utxo.GetHex();
      tx_req.SetHex(utxo_tx_hex);
      tx_req.SetNetwork(request->GetNetwork());
      TransactionJsonApi::DecodeRawTransaction(&tx_req, &tx_res);
      input.SetNon_witness_utxo(tx_res);

      if (request->GetHasDetail()) {
        input.SetNon_witness_utxo_hex(utxo_tx_hex);
        if (utxo_tx_hex.empty()) {
          input.SetIgnoreItem("non_witness_utxo_hex");
        }
        if (request->GetHasSimple()) {
          input.SetIgnoreItem("non_witness_utxo");
        }
      } else {
        input.SetIgnoreItem("non_witness_utxo_hex");
      }
      if (has_amount) {
        // do nothing
      } else if (full_utxo.GetTxOutCount() > tx_input.GetVout()) {
        auto txout = full_utxo.GetTxOut(tx_input.GetVout());
        total_input += txout.GetValue();
        has_amount = true;
      } else {
        input.SetIgnoreItem("non_witness_utxo");
        is_unset_utxo = true;
      }
    }

    auto sig_pubkey_list = psbt.GetTxInSignaturePubkeyList(index);
    if (sig_pubkey_list.empty()) {
      input.SetIgnoreItem("partial_signatures");
    } else {
      auto& sig_list = input.GetPartial_signatures();
      for (auto pubkey : sig_pubkey_list) {
        auto sig = psbt.GetTxInSignature(index, pubkey);
        PsbtSignatureData sig_data;
        sig_data.SetPubkey(pubkey.GetHex());
        sig_data.SetSignature(sig.GetHex());
        sig_list.emplace_back(sig_data);
      }
    }

    if (!psbt.IsFindTxInSighashType(index)) {
      input.SetIgnoreItem("sighash");
    } else {
      auto sighashtype = psbt.GetTxInSighashType(index);
      input.SetSighash(sighashtype.ToString());
    }

    Script redeem_script = psbt.GetTxInRedeemScriptDirect(index, true, false);
    if (redeem_script.IsEmpty()) {
      input.SetIgnoreItem("redeem_script");
    } else {
      std::string script_type;
      auto addr_list = TransactionJsonApi::ConvertFromLockingScript(
          addr_factory, redeem_script, &script_type, nullptr);
      input.GetRedeem_script().SetHex(redeem_script.GetHex());
      input.GetRedeem_script().SetAsm(redeem_script.ToString());
      input.GetRedeem_script().SetType(script_type);
    }

    Script witness_script = psbt.GetTxInRedeemScriptDirect(index, true, true);
    if (witness_script.IsEmpty()) {
      input.SetIgnoreItem("witness_script");
    } else {
      std::string script_type;
      auto addr_list = TransactionJsonApi::ConvertFromLockingScript(
          addr_factory, witness_script, &script_type, nullptr);
      input.GetWitness_script().SetHex(witness_script.GetHex());
      input.GetWitness_script().SetAsm(witness_script.ToString());
      input.GetWitness_script().SetType(script_type);
    }

    auto bip32_pubkey_list = psbt.GetTxInKeyDataList(index);
    if (bip32_pubkey_list.empty()) {
      input.SetIgnoreItem("bip32_derivs");
    } else {
      auto& bip32_list = input.GetBip32_derivs();
      for (auto key_data : bip32_pubkey_list) {
        PsbtBip32Data bip32_data;
        bip32_data.SetPubkey(key_data.GetPubkey().GetHex());
        bip32_data.SetMaster_fingerprint(key_data.GetFingerprint().GetHex());
        bip32_data.SetPath(key_data.GetBip32Path());
        
          if (request->GetHasDetail()) {
            bip32_data.SetDescriptor(key_data.ToString());
          } else {
            bip32_data.SetIgnoreItem("descriptor");
          }
        bip32_list.emplace_back(bip32_data);
      }
    }

    auto scriptsig_arr = psbt.GetTxInFinalScript(index, false);
    if ((!scriptsig_arr.empty()) && (!scriptsig_arr[0].IsEmpty())) {
      input.GetFinal_scriptsig().SetHex(scriptsig_arr[0].GetHex());
      input.GetFinal_scriptsig().SetAsm(Script(scriptsig_arr[0]).ToString());
    } else {
      input.SetIgnoreItem("final_scriptsig");
    }

    auto witness_stack = psbt.GetTxInFinalScript(index, true);
    if (witness_stack.empty()) {
      input.SetIgnoreItem("final_scriptwitness");
    } else {
      auto& witness = input.GetFinal_scriptwitness();
      for (const auto& stack : witness_stack) {
        witness.emplace_back(stack.GetHex());
      }
    }

    key_list = psbt.GetTxInRecordKeyList(index);
    for (const auto& key : key_list) {
      auto data = psbt.GetTxInRecord(index, key);
      item.SetKey(key.GetHex());
      item.SetValue(data.GetHex());
      input.GetUnknown().emplace_back(item);
    }
    if (input.GetUnknown().empty()) input.SetIgnoreItem("unknown");

    response->GetInputs().push_back(input);
  }

  Amount total_output;
  max = static_cast<uint32_t>(tx.GetTxOutCount());
  for (uint32_t index=0; index<tx.GetTxOutCount(); ++index) {
    DecodePsbtOutput output;
    const auto& txout = tx.GetTxOut(index);
    total_output += txout.GetValue();
    bool is_witness = false;
    auto script = psbt.GetTxOutScript(index, true, &is_witness);
    if (script.IsEmpty()) {
      output.SetIgnoreItem("redeem_script");
      output.SetIgnoreItem("witness_script");
    } else if (is_witness) {
      output.GetWitness_script().SetHex(script.GetHex());
      output.GetWitness_script().SetAsm(script.ToString());
      if (txout.GetLockingScript().IsP2shScript()) {
        auto sh_script = ScriptUtil::CreateP2wshLockingScript(script);
        output.GetRedeem_script().SetHex(sh_script.GetHex());
        output.GetRedeem_script().SetAsm(sh_script.ToString());
      } else {
        output.SetIgnoreItem("redeem_script");
      }
    } else {
      output.SetIgnoreItem("witness_script");
      output.GetRedeem_script().SetHex(script.GetHex());
      output.GetRedeem_script().SetAsm(script.ToString());
    }

    auto bip32_pubkey_list = psbt.GetTxOutKeyDataList(index);
    if (bip32_pubkey_list.empty()) {
      output.SetIgnoreItem("bip32_derivs");
    } else {
      auto& bip32_list = output.GetBip32_derivs();
      for (auto key_data : bip32_pubkey_list) {
        PsbtBip32Data bip32_data;
        bip32_data.SetPubkey(key_data.GetPubkey().GetHex());
        bip32_data.SetMaster_fingerprint(key_data.GetFingerprint().GetHex());
        bip32_data.SetPath(key_data.GetBip32Path());
        
          if (request->GetHasDetail()) {
            bip32_data.SetDescriptor(key_data.ToString());
          } else {
            bip32_data.SetIgnoreItem("descriptor");
          }
        bip32_list.emplace_back(bip32_data);
      }
    }

    key_list = psbt.GetTxOutRecordKeyList(index);
    for (const auto& key : key_list) {
      auto data = psbt.GetTxOutRecord(index, key);
      item.SetKey(key.GetHex());
      item.SetValue(data.GetHex());
      output.GetUnknown().emplace_back(item);
    }
    if (output.GetUnknown().empty()) output.SetIgnoreItem("unknown");

    response->GetOutputs().push_back(output);
  }

  if (is_unset_utxo || (total_output > total_input)) {
    response->SetIgnoreItem("fee");
  } else {
    response->SetFee((total_input - total_output).GetSatoshiValue());
  }
}